

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void add_bottom_part(Am_Object *this_search_window,int *current_y)

{
  int *this;
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Object *pAVar4;
  Am_Method_Wrapper *pAVar5;
  Am_Value_List *pAVar6;
  Am_Constraint *pAVar7;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Input_Char local_e4;
  Am_Value local_e0;
  Am_Object local_d0;
  Am_Value_List local_c8;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object local_20;
  int *local_18;
  int *current_y_local;
  Am_Object *this_search_window_local;
  
  local_18 = current_y;
  current_y_local = (int *)this_search_window;
  Am_Object::Create(&local_28,(char *)&Am_Border_Rectangle);
  pAVar1 = Am_Object::Set(&local_28,100,5,0);
  pAVar1 = Am_Object::Set(pAVar1,0x65,*local_18,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x1b8,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x3a,0);
  pAVar1 = Am_Object::Set(pAVar1,0x172,0,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar2,0);
  Am_Object::Am_Object(&local_20,pAVar1);
  pAVar1 = Am_Object::Add_Part(this_search_window,&local_20,true,0);
  Am_Object::Create(&local_48,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_48,100,10,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,*local_18 + 0x14,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"Find by Location:",0);
  pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
  pAVar3 = Am_Object::Set(pAVar3,0xac,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar2,0);
  Am_Object::Am_Object(local_40,pAVar3);
  pAVar1 = Am_Object::Add_Part(pAVar1,local_40,true,0);
  Am_Object::Create(&local_58,(char *)&Am_Button_Panel);
  pAVar3 = Am_Object::Set(&local_58,100,0x8c,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,*local_18 + 5,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar2,0);
  Am_Value_List::Am_Value_List(&local_68);
  Am_Object::Create(&local_70,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_70,0x150,"Find up",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_up);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(&local_68,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_78,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_78,0x150,"Find left",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_left);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_80,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_80,0x150,"Find Inside",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_inside);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_88,(char *)&Am_Find_Command);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_down);
  pAVar4 = Am_Object::Set(&local_88,0xca,pAVar5,0);
  pAVar4 = Am_Object::Set(pAVar4,0x150,"Find down",0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_90,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_90,0x150,"Find right",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_right);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_98,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_98,0x150,"Find Outside",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_outside);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar2,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x96,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x9c,3,0);
  Am_Object::Am_Object(&local_50,pAVar3);
  Am_Object::Add_Part(pAVar1,&local_50,true,0);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_68);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  this = current_y_local;
  *local_18 = *local_18 + 0x3f;
  Am_Object::Create(&local_a8,(char *)&Am_Border_Rectangle);
  pAVar1 = Am_Object::Set(&local_a8,100,5,0);
  pAVar1 = Am_Object::Set(pAVar1,0x65,*local_18,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x1b8,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x2b,0);
  pAVar1 = Am_Object::Set(pAVar1,0x172,0,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar2,0);
  Am_Object::Am_Object(&local_a0,pAVar1);
  pAVar1 = Am_Object::Add_Part((Am_Object *)this,&local_a0,true,0);
  Am_Object::Create(&local_b8,(char *)&Am_Button_Panel);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar3 = Am_Object::Set(&local_b8,100,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,*local_18 + 5,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar2,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,0x14,0);
  pAVar3 = Am_Object::Set(pAVar3,0x96,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x9c,0,0);
  Am_Value_List::Am_Value_List(&local_c8);
  Am_Object::Create(&local_d0,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_d0,0x150,"Find Next",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_next);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar4 = Am_Object::Set(pAVar4,0x180,true,0);
  Am_Input_Char::Am_Input_Char(&local_e4,"RETURN",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_e0);
  pAVar4 = Am_Object::Set(pAVar4,0x152,&local_e0,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(&local_c8,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_f0,(char *)&Am_Find_Command);
  pAVar4 = Am_Object::Set(&local_f0,0x150,"Find Previous",0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_find_previous);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_f8,(char *)&Am_Command);
  pAVar4 = Am_Object::Set(&local_f8,0x154,-1,0);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&done_search);
  pAVar4 = Am_Object::Set(pAVar4,0xca,pAVar5,0);
  pAVar4 = Am_Object::Set(pAVar4,0x150,"Done",0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar2,Am_TAIL,true);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar2,0);
  Am_Object::Am_Object(&local_b0,pAVar3);
  Am_Object::Add_Part(pAVar1,&local_b0,true,0);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_f0);
  Am_Value::~Am_Value(&local_e0);
  Am_Object::~Am_Object(&local_d0);
  Am_Value_List::~Am_Value_List(&local_c8);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_a8);
  *local_18 = *local_18 + 0x30;
  return;
}

Assistant:

void
add_bottom_part(Am_Object &this_search_window, int &current_y)
{
  this_search_window
      .Add_Part(Am_Border_Rectangle.Create()
                    .Set(Am_LEFT, 5)
                    .Set(Am_TOP, current_y)
                    .Set(Am_WIDTH, WINDOW_WIDTH - 10)
                    .Set(Am_HEIGHT, 58)
                    .Set(Am_SELECTED, 0)
                    .Set(Am_FILL_STYLE, Am_Default_Color))
      .Add_Part(Am_Text.Create()
                    .Set(Am_LEFT, 10)
                    .Set(Am_TOP, current_y + 20)
                    .Set(Am_TEXT, "Find by Location:")
                    .Set(Am_FONT, search_bold_font)
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_No_Style))
      .Add_Part(
          Am_Button_Panel.Create()
              .Set(Am_LEFT, 140)
              .Set(Am_TOP, current_y + 5)
              .Set(Am_FILL_STYLE, Am_Default_Color)
              .Set(Am_ITEMS, Am_Value_List()
                                 .Add(Am_Find_Command.Create()
                                          .Set(Am_LABEL, "Find up")
                                          .Set(Am_DO_METHOD, do_find_up))
                                 .Add(Am_Find_Command.Create()
                                          .Set(Am_LABEL, "Find left")
                                          .Set(Am_DO_METHOD, do_find_left))
                                 .Add(Am_Find_Command.Create()
                                          .Set(Am_LABEL, "Find Inside")
                                          .Set(Am_DO_METHOD, do_find_inside))
                                 .Add(Am_Find_Command.Create()
                                          .Set(Am_DO_METHOD, do_find_down)
                                          .Set(Am_LABEL, "Find down"))
                                 .Add(Am_Find_Command.Create()
                                          .Set(Am_LABEL, "Find right")
                                          .Set(Am_DO_METHOD, do_find_right))
                                 .Add(Am_Find_Command.Create()
                                          .Set(Am_LABEL, "Find Outside")
                                          .Set(Am_DO_METHOD, do_find_outside)))
              .Set(Am_LAYOUT, Am_Horizontal_Layout)
              .Set(Am_H_SPACING, 0)
              .Set(Am_V_SPACING, 0)
              .Set(Am_MAX_RANK, 3));
  current_y = current_y + 58 + 5;
  this_search_window
      .Add_Part(Am_Border_Rectangle.Create()
                    .Set(Am_LEFT, 5)
                    .Set(Am_TOP, current_y)
                    .Set(Am_WIDTH, WINDOW_WIDTH - 10)
                    .Set(Am_HEIGHT, 43)
                    .Set(Am_SELECTED, 0)
                    .Set(Am_FILL_STYLE, Am_Default_Color))
      .Add_Part(
          Am_Button_Panel.Create()
              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
              .Set(Am_TOP, current_y + 5)
              .Set(Am_FILL_STYLE, Am_Default_Color)
              .Set(Am_LAYOUT, Am_Horizontal_Layout)
              .Set(Am_H_SPACING, 20)
              .Set(Am_V_SPACING, 0)
              .Set(Am_MAX_RANK, 0)
              .Set(Am_ITEMS,
                   Am_Value_List()
                       .Add(Am_Find_Command.Create()
                                .Set(Am_LABEL, "Find Next")
                                .Set(Am_DO_METHOD, do_find_next)
                                .Set(Am_DEFAULT, true)
                                .Set(Am_ACCELERATOR, Am_Input_Char("RETURN")))
                       .Add(Am_Find_Command.Create()
                                .Set(Am_LABEL, "Find Previous")
                                .Set(Am_DO_METHOD, do_find_previous))
                       .Add(Am_Command.Create()
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, done_search)
                                .Set(Am_LABEL, "Done"))));
  current_y = current_y + 43 + 5;
}